

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe40At0(uint8_t *buf)

{
  return (ulong)*buf |
         (ulong)buf[1] << 8 | (ulong)buf[2] << 0x10 | (ulong)*(ushort *)(buf + 3) << 0x18;
}

Assistant:

std::uint64_t readFlUIntLe40At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[0];
    res &= UINT64_C(0xffffffffff);
    return res;
}